

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialaddress.cpp
# Opt level: O0

void __thiscall
ElementsConfidentialAddress_P2shWrappedP2wpkhAddressFromString_Test::TestBody
          (ElementsConfidentialAddress_P2shWrappedP2wpkhAddressFromString_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_c88;
  Message local_c80;
  ElementsAddressType local_c78;
  AddressType local_c74;
  undefined1 local_c70 [8];
  AssertionResult gtest_ar_11;
  Message local_c58;
  ElementsNetType local_c50;
  NetType local_c4c;
  undefined1 local_c48 [8];
  AssertionResult gtest_ar_10;
  AssertHelper local_c18;
  Message local_c10;
  string local_c08;
  bool local_be1;
  undefined1 local_be0 [8];
  AssertionResult gtest_ar__1;
  Message local_bc8;
  Address local_bc0;
  string local_a40;
  undefined1 local_a20 [8];
  AssertionResult gtest_ar_9;
  Message local_a08;
  ByteData local_a00;
  string local_9e8;
  undefined1 local_9c8 [8];
  AssertionResult gtest_ar_8;
  Message local_9b0;
  ConfidentialKey local_9a8;
  string local_990;
  undefined1 local_970 [8];
  AssertionResult gtest_ar_7;
  Message local_958;
  string local_950;
  undefined1 local_930 [8];
  AssertionResult gtest_ar_6;
  Message local_918;
  allocator local_909;
  string local_908;
  ElementsConfidentialAddress local_8e8;
  AssertHelper local_730;
  Message local_728;
  ElementsAddressType local_720;
  AddressType local_71c;
  undefined1 local_718 [8];
  AssertionResult gtest_ar_5;
  Message local_700;
  ElementsNetType local_6f8;
  NetType local_6f4;
  undefined1 local_6f0 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_6c0;
  Message local_6b8;
  string local_6b0;
  bool local_689;
  undefined1 local_688 [8];
  AssertionResult gtest_ar_;
  Message local_670;
  Address local_668;
  string local_4e8;
  undefined1 local_4c8 [8];
  AssertionResult gtest_ar_3;
  Message local_4b0;
  ByteData local_4a8;
  string local_490;
  undefined1 local_470 [8];
  AssertionResult gtest_ar_2;
  Message local_458;
  ConfidentialKey local_450;
  string local_438;
  undefined1 local_418 [8];
  AssertionResult gtest_ar_1;
  Message local_400;
  string local_3f8;
  undefined1 local_3d8 [8];
  AssertionResult gtest_ar;
  Message local_3c0;
  allocator local_3b1;
  string local_3b0;
  ElementsConfidentialAddress local_390;
  undefined1 local_1c8 [8];
  ElementsConfidentialAddress address;
  ElementsConfidentialAddress_P2shWrappedP2wpkhAddressFromString_Test *this_local;
  
  address.address_.field_2._8_8_ = this;
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)local_1c8);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_3b0,
                 "VJLBL3rkCh19CDi889GPXkn1BYqUih5DF2p8ViS2J4Tr2cnYHZSM3ydLeZvFxSQ1MK8cXrXdQYVwx3i1",
                 &local_3b1);
      cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress(&local_390,&local_3b0);
      cfd::core::ElementsConfidentialAddress::operator=
                ((ElementsConfidentialAddress *)local_1c8,&local_390);
      cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&local_390);
      std::__cxx11::string::~string((string *)&local_3b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
    }
  }
  else {
    testing::Message::Message(&local_3c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x160,
               "Expected: (address = ElementsConfidentialAddress( \"VJLBL3rkCh19CDi889GPXkn1BYqUih5DF2p8ViS2J4Tr2cnYHZSM3ydLeZvFxSQ1MK8cXrXdQYVwx3i1\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,&local_3c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(&local_3c0);
  }
  cfd::core::ElementsConfidentialAddress::GetAddress_abi_cxx11_
            (&local_3f8,(ElementsConfidentialAddress *)local_1c8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_3d8,
             "\"VJLBL3rkCh19CDi889GPXkn1BYqUih5DF2p8ViS2J4Tr2cnYHZSM3ydLeZvFxSQ1MK8cXrXdQYVwx3i1\"",
             "address.GetAddress().c_str()",
             "VJLBL3rkCh19CDi889GPXkn1BYqUih5DF2p8ViS2J4Tr2cnYHZSM3ydLeZvFxSQ1MK8cXrXdQYVwx3i1",
             pcVar2);
  std::__cxx11::string::~string((string *)&local_3f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d8);
  if (!bVar1) {
    testing::Message::Message(&local_400);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x163,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_400);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_400);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d8);
  cfd::core::ElementsConfidentialAddress::GetConfidentialKey
            (&local_450,(ElementsConfidentialAddress *)local_1c8);
  cfd::core::Pubkey::GetHex_abi_cxx11_(&local_438,&local_450);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_418,
             "\"02d570f84ffe5bdf7583400af2e6b9e219210ecf29a333757481cbca826ada8e16\"",
             "address.GetConfidentialKey().GetHex().c_str()",
             "02d570f84ffe5bdf7583400af2e6b9e219210ecf29a333757481cbca826ada8e16",pcVar2);
  std::__cxx11::string::~string((string *)&local_438);
  cfd::core::Pubkey::~Pubkey(&local_450);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_418);
  if (!bVar1) {
    testing::Message::Message(&local_458);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_418);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x166,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_458);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_458);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_418);
  cfd::core::ElementsConfidentialAddress::GetHash
            (&local_4a8,(ElementsConfidentialAddress *)local_1c8);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_490,&local_4a8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_470,"\"19970f64fb36fe3b7b21eca335ff70dde51eb8c8\"",
             "address.GetHash().GetHex().c_str()","19970f64fb36fe3b7b21eca335ff70dde51eb8c8",pcVar2)
  ;
  std::__cxx11::string::~string((string *)&local_490);
  cfd::core::ByteData::~ByteData(&local_4a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_470);
  if (!bVar1) {
    testing::Message::Message(&local_4b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_470);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x168,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_4b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_4b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_470);
  cfd::core::ElementsConfidentialAddress::GetUnblindedAddress
            (&local_668,(ElementsConfidentialAddress *)local_1c8);
  cfd::core::Address::GetAddress_abi_cxx11_(&local_4e8,&local_668);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_4c8,"\"GjWqFsdByr7TVs1SFiMmAaFwgSPAz5xzQm\"",
             "address.GetUnblindedAddress().GetAddress().c_str()",
             "GjWqFsdByr7TVs1SFiMmAaFwgSPAz5xzQm",pcVar2);
  std::__cxx11::string::~string((string *)&local_4e8);
  cfd::core::Address::~Address(&local_668);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4c8);
  if (!bVar1) {
    testing::Message::Message(&local_670);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x16a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_670);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_670);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c8);
  cfd::core::ElementsConfidentialAddress::GetAddress_abi_cxx11_
            (&local_6b0,(ElementsConfidentialAddress *)local_1c8);
  local_689 = cfd::core::ElementsConfidentialAddress::IsConfidentialAddress(&local_6b0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_688,&local_689,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_6b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_688);
  if (!bVar1) {
    testing::Message::Message(&local_6b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_4.message_,(internal *)local_688,
               (AssertionResult *)
               "ElementsConfidentialAddress::IsConfidentialAddress(address.GetAddress())","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_6c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x16c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_6c0,&local_6b8);
    testing::internal::AssertHelper::~AssertHelper(&local_6c0);
    std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_6b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_688);
  local_6f4 = kLiquidV1;
  local_6f8 = cfd::core::ElementsConfidentialAddress::GetNetType
                        ((ElementsConfidentialAddress *)local_1c8);
  testing::internal::EqHelper<false>::Compare<cfd::core::NetType,cfd::core::NetType>
            ((EqHelper<false> *)local_6f0,"ElementsNetType::kLiquidV1","address.GetNetType()",
             &local_6f4,&local_6f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6f0);
  if (!bVar1) {
    testing::Message::Message(&local_700);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x16d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_700);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_700);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6f0);
  local_71c = kP2shAddress;
  local_720 = cfd::core::ElementsConfidentialAddress::GetAddressType
                        ((ElementsConfidentialAddress *)local_1c8);
  testing::internal::EqHelper<false>::Compare<cfd::core::AddressType,cfd::core::AddressType>
            ((EqHelper<false> *)local_718,"ElementsAddressType::kP2shAddress",
             "address.GetAddressType()",&local_71c,&local_720);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_718);
  if (!bVar1) {
    testing::Message::Message(&local_728);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_718);
    testing::internal::AssertHelper::AssertHelper
              (&local_730,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x16e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_730,&local_728);
    testing::internal::AssertHelper::~AssertHelper(&local_730);
    testing::Message::~Message(&local_728);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_718);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_908,
                 "AzppkWN3gNvcnBu2Pm4Nsi8EdCmugMU2zjbpsMQZGBfMDmBZpEpP4oQSsdKNVYZmDtn7qLEyXoK7qUrY",
                 &local_909);
      cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress(&local_8e8,&local_908);
      cfd::core::ElementsConfidentialAddress::operator=
                ((ElementsConfidentialAddress *)local_1c8,&local_8e8);
      cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&local_8e8);
      std::__cxx11::string::~string((string *)&local_908);
      std::allocator<char>::~allocator((allocator<char> *)&local_909);
    }
  }
  else {
    testing::Message::Message(&local_918);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x173,
               "Expected: (address = ElementsConfidentialAddress( \"AzppkWN3gNvcnBu2Pm4Nsi8EdCmugMU2zjbpsMQZGBfMDmBZpEpP4oQSsdKNVYZmDtn7qLEyXoK7qUrY\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_918);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_918);
  }
  cfd::core::ElementsConfidentialAddress::GetAddress_abi_cxx11_
            (&local_950,(ElementsConfidentialAddress *)local_1c8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_930,
             "\"AzppkWN3gNvcnBu2Pm4Nsi8EdCmugMU2zjbpsMQZGBfMDmBZpEpP4oQSsdKNVYZmDtn7qLEyXoK7qUrY\"",
             "address.GetAddress().c_str()",
             "AzppkWN3gNvcnBu2Pm4Nsi8EdCmugMU2zjbpsMQZGBfMDmBZpEpP4oQSsdKNVYZmDtn7qLEyXoK7qUrY",
             pcVar2);
  std::__cxx11::string::~string((string *)&local_950);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_930);
  if (!bVar1) {
    testing::Message::Message(&local_958);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_930);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x176,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_958);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_958);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_930);
  cfd::core::ElementsConfidentialAddress::GetConfidentialKey
            (&local_9a8,(ElementsConfidentialAddress *)local_1c8);
  cfd::core::Pubkey::GetHex_abi_cxx11_(&local_990,&local_9a8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_970,
             "\"02d570f84ffe5bdf7583400af2e6b9e219210ecf29a333757481cbca826ada8e16\"",
             "address.GetConfidentialKey().GetHex().c_str()",
             "02d570f84ffe5bdf7583400af2e6b9e219210ecf29a333757481cbca826ada8e16",pcVar2);
  std::__cxx11::string::~string((string *)&local_990);
  cfd::core::Pubkey::~Pubkey(&local_9a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_970);
  if (!bVar1) {
    testing::Message::Message(&local_9b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_970);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x179,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_9b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_9b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_970);
  cfd::core::ElementsConfidentialAddress::GetHash
            (&local_a00,(ElementsConfidentialAddress *)local_1c8);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_9e8,&local_a00);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_9c8,"\"19970f64fb36fe3b7b21eca335ff70dde51eb8c8\"",
             "address.GetHash().GetHex().c_str()","19970f64fb36fe3b7b21eca335ff70dde51eb8c8",pcVar2)
  ;
  std::__cxx11::string::~string((string *)&local_9e8);
  cfd::core::ByteData::~ByteData(&local_a00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9c8);
  if (!bVar1) {
    testing::Message::Message(&local_a08);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_9c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x17b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_a08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_a08);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9c8);
  cfd::core::ElementsConfidentialAddress::GetUnblindedAddress
            (&local_bc0,(ElementsConfidentialAddress *)local_1c8);
  cfd::core::Address::GetAddress_abi_cxx11_(&local_a40,&local_bc0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_a20,"\"XDgYhnMZYLnzwU2Z8pMEd64GLbf8W9A5vA\"",
             "address.GetUnblindedAddress().GetAddress().c_str()",
             "XDgYhnMZYLnzwU2Z8pMEd64GLbf8W9A5vA",pcVar2);
  std::__cxx11::string::~string((string *)&local_a40);
  cfd::core::Address::~Address(&local_bc0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a20);
  if (!bVar1) {
    testing::Message::Message(&local_bc8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x17d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_bc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_bc8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a20);
  cfd::core::ElementsConfidentialAddress::GetAddress_abi_cxx11_
            (&local_c08,(ElementsConfidentialAddress *)local_1c8);
  local_be1 = cfd::core::ElementsConfidentialAddress::IsConfidentialAddress(&local_c08);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_be0,&local_be1,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_c08);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_be0);
  if (!bVar1) {
    testing::Message::Message(&local_c10);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_10.message_,(internal *)local_be0,
               (AssertionResult *)
               "ElementsConfidentialAddress::IsConfidentialAddress(address.GetAddress())","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x17f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c18,&local_c10);
    testing::internal::AssertHelper::~AssertHelper(&local_c18);
    std::__cxx11::string::~string((string *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_c10);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_be0);
  local_c4c = kElementsRegtest;
  local_c50 = cfd::core::ElementsConfidentialAddress::GetNetType
                        ((ElementsConfidentialAddress *)local_1c8);
  testing::internal::EqHelper<false>::Compare<cfd::core::NetType,cfd::core::NetType>
            ((EqHelper<false> *)local_c48,"ElementsNetType::kElementsRegtest","address.GetNetType()"
             ,&local_c4c,&local_c50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c48);
  if (!bVar1) {
    testing::Message::Message(&local_c58);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c48);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x180,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_c58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_c58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c48);
  local_c74 = kP2shAddress;
  local_c78 = cfd::core::ElementsConfidentialAddress::GetAddressType
                        ((ElementsConfidentialAddress *)local_1c8);
  testing::internal::EqHelper<false>::Compare<cfd::core::AddressType,cfd::core::AddressType>
            ((EqHelper<false> *)local_c70,"ElementsAddressType::kP2shAddress",
             "address.GetAddressType()",&local_c74,&local_c78);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c70);
  if (!bVar1) {
    testing::Message::Message(&local_c80);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c70);
    testing::internal::AssertHelper::AssertHelper
              (&local_c88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x181,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c88,&local_c80);
    testing::internal::AssertHelper::~AssertHelper(&local_c88);
    testing::Message::~Message(&local_c80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c70);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)local_1c8);
  return;
}

Assistant:

TEST(ElementsConfidentialAddress, P2shWrappedP2wpkhAddressFromString) {
  ElementsConfidentialAddress address;

  EXPECT_NO_THROW(
      (address =
          ElementsConfidentialAddress(
              "VJLBL3rkCh19CDi889GPXkn1BYqUih5DF2p8ViS2J4Tr2cnYHZSM3ydLeZvFxSQ1MK8cXrXdQYVwx3i1")));
  EXPECT_STREQ(
      "VJLBL3rkCh19CDi889GPXkn1BYqUih5DF2p8ViS2J4Tr2cnYHZSM3ydLeZvFxSQ1MK8cXrXdQYVwx3i1",
      address.GetAddress().c_str());
  EXPECT_STREQ(
      "02d570f84ffe5bdf7583400af2e6b9e219210ecf29a333757481cbca826ada8e16",
      address.GetConfidentialKey().GetHex().c_str());
  EXPECT_STREQ("19970f64fb36fe3b7b21eca335ff70dde51eb8c8",
               address.GetHash().GetHex().c_str());
  EXPECT_STREQ("GjWqFsdByr7TVs1SFiMmAaFwgSPAz5xzQm",
               address.GetUnblindedAddress().GetAddress().c_str());
  EXPECT_TRUE(
      ElementsConfidentialAddress::IsConfidentialAddress(address.GetAddress()));
  EXPECT_EQ(ElementsNetType::kLiquidV1, address.GetNetType());
  EXPECT_EQ(ElementsAddressType::kP2shAddress, address.GetAddressType());

  EXPECT_NO_THROW(
      (address =
          ElementsConfidentialAddress(
              "AzppkWN3gNvcnBu2Pm4Nsi8EdCmugMU2zjbpsMQZGBfMDmBZpEpP4oQSsdKNVYZmDtn7qLEyXoK7qUrY")));
  EXPECT_STREQ(
      "AzppkWN3gNvcnBu2Pm4Nsi8EdCmugMU2zjbpsMQZGBfMDmBZpEpP4oQSsdKNVYZmDtn7qLEyXoK7qUrY",
      address.GetAddress().c_str());
  EXPECT_STREQ(
      "02d570f84ffe5bdf7583400af2e6b9e219210ecf29a333757481cbca826ada8e16",
      address.GetConfidentialKey().GetHex().c_str());
  EXPECT_STREQ("19970f64fb36fe3b7b21eca335ff70dde51eb8c8",
               address.GetHash().GetHex().c_str());
  EXPECT_STREQ("XDgYhnMZYLnzwU2Z8pMEd64GLbf8W9A5vA",
               address.GetUnblindedAddress().GetAddress().c_str());
  EXPECT_TRUE(
      ElementsConfidentialAddress::IsConfidentialAddress(address.GetAddress()));
  EXPECT_EQ(ElementsNetType::kElementsRegtest, address.GetNetType());
  EXPECT_EQ(ElementsAddressType::kP2shAddress, address.GetAddressType());
}